

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O3

Node * __thiscall wabt::AST::InsertNode(AST *this,NodeType ntype,ExprType etype,Expr *e,Index nargs)

{
  vector<wabt::Node,_std::allocator<wabt::Node>_> *this_00;
  iterator __last;
  pointer pNVar1;
  ulong __n;
  ulong uVar2;
  Node *__args;
  Node local_60;
  
  __n = (ulong)nargs;
  if (__n <= (ulong)(((long)(this->exp_stack).
                            super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->exp_stack).
                            super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                            super__Vector_impl_data._M_start >> 4) * -0x5555555555555555)) {
    this_00 = &local_60.children;
    local_60.children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_60.children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_60.children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_60.u.var = (Var *)0x0;
    local_60.ntype = ntype;
    local_60.etype = etype;
    local_60.e = e;
    std::vector<wabt::Node,_std::allocator<wabt::Node>_>::reserve(this_00,__n);
    if (nargs != 0) {
      __args = (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl
               .super__Vector_impl_data._M_finish + -__n;
      uVar2 = __n + 1;
      do {
        std::vector<wabt::Node,_std::allocator<wabt::Node>_>::emplace_back<wabt::Node>
                  (this_00,__args);
        __args = __args + 1;
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
    __last._M_current =
         (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
         super__Vector_impl_data._M_finish;
    std::vector<wabt::Node,_std::allocator<wabt::Node>_>::_M_erase
              (&this->exp_stack,__last._M_current + -__n,__last);
    std::vector<wabt::Node,_std::allocator<wabt::Node>_>::emplace_back<wabt::Node>
              (&this->exp_stack,&local_60);
    pNVar1 = (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
             super__Vector_impl_data._M_finish;
    std::vector<wabt::Node,_std::allocator<wabt::Node>_>::~vector(this_00);
    return pNVar1 + -1;
  }
  __assert_fail("exp_stack.size() >= nargs",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/decompiler-ast.h"
                ,0x62,"Node &wabt::AST::InsertNode(NodeType, ExprType, const Expr *, Index)");
}

Assistant:

Node& InsertNode(NodeType ntype, ExprType etype, const Expr* e, Index nargs) {
    assert(exp_stack.size() >= nargs);
    Node n{ntype, etype, e, nullptr};
    n.children.reserve(nargs);
    std::move(exp_stack.end() - nargs, exp_stack.end(),
              std::back_inserter(n.children));
    exp_stack.erase(exp_stack.end() - nargs, exp_stack.end());
    exp_stack.push_back(std::move(n));
    return exp_stack.back();
  }